

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O0

void __thiscall solitaire::graphics::Renderer::setButtonsAlpha(Renderer *this)

{
  int iVar1;
  undefined4 extraout_var;
  ulong uVar2;
  pointer pGVar3;
  undefined4 extraout_var_00;
  TextureId local_20;
  TextureId local_1c;
  TextureId local_18;
  TextureId local_14;
  Renderer *local_10;
  Renderer *this_local;
  
  local_10 = this;
  iVar1 = (*this->context->_vptr_Context[0xd])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar1) + 0x20))();
  if ((uVar2 & 1) == 0) {
    pGVar3 = std::
             unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ::operator->(&this->graphicsSystem);
    TextureId::TextureId(&local_18,&this->newGameId);
    (*pGVar3->_vptr_GraphicsSystem[4])(pGVar3,&local_18,0x96);
  }
  else {
    pGVar3 = std::
             unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ::operator->(&this->graphicsSystem);
    TextureId::TextureId(&local_14,&this->newGameId);
    (*pGVar3->_vptr_GraphicsSystem[4])(pGVar3,&local_14,0xff);
  }
  iVar1 = (*this->context->_vptr_Context[0xf])();
  uVar2 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar1) + 0x20))();
  if ((uVar2 & 1) == 0) {
    pGVar3 = std::
             unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ::operator->(&this->graphicsSystem);
    TextureId::TextureId(&local_20,&this->undoId);
    (*pGVar3->_vptr_GraphicsSystem[4])(pGVar3,&local_20,0x96);
  }
  else {
    pGVar3 = std::
             unique_ptr<solitaire::graphics::interfaces::GraphicsSystem,_std::default_delete<solitaire::graphics::interfaces::GraphicsSystem>_>
             ::operator->(&this->graphicsSystem);
    TextureId::TextureId(&local_1c,&this->undoId);
    (*pGVar3->_vptr_GraphicsSystem[4])(pGVar3,&local_1c,0xff);
  }
  return;
}

Assistant:

void Renderer::setButtonsAlpha() const {
    if (context.getNewGameButton().isHovered())
        graphicsSystem->setTextureAlpha(newGameId, noAlpha);
    else
        graphicsSystem->setTextureAlpha(newGameId, buttonAlpha);

    if (context.getUndoButton().isHovered())
        graphicsSystem->setTextureAlpha(undoId, noAlpha);
    else
        graphicsSystem->setTextureAlpha(undoId, buttonAlpha);
}